

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

void Abc_CexFreeP(Abc_Cex_t **p)

{
  Abc_Cex_t **p_local;
  
  if (*p != (Abc_Cex_t *)0x0) {
    if (*p == (Abc_Cex_t *)0x1) {
      *p = (Abc_Cex_t *)0x0;
    }
    else if (*p != (Abc_Cex_t *)0x0) {
      free(*p);
      *p = (Abc_Cex_t *)0x0;
    }
  }
  return;
}

Assistant:

void Abc_CexFreeP( Abc_Cex_t ** p )
{
    if ( *p == NULL )
        return;
    if ( *p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
        *p = NULL;
    else
        ABC_FREE( *p );
}